

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O2

void * lws_protocol_vh_priv_zalloc(lws_vhost *vhost,lws_protocols *prot,int size)

{
  uint uVar1;
  char *__s1;
  int iVar2;
  void **ppvVar3;
  long lVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (((prot == (lws_protocols *)0x0 || vhost == (lws_vhost *)0x0) ||
      (vhost->protocols == (lws_protocols *)0x0)) || (prot->name == (char *)0x0)) {
LAB_00111c53:
    pvVar5 = (void *)0x0;
  }
  else {
    if (vhost->protocol_vh_privs == (void **)0x0) {
      ppvVar3 = (void **)lws_zalloc((long)vhost->count_protocols << 3,"protocol_vh_privs");
      vhost->protocol_vh_privs = ppvVar3;
      if (ppvVar3 == (void **)0x0) goto LAB_00111c53;
    }
    uVar1 = vhost->count_protocols;
    lVar4 = 0;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    uVar6 = 0;
    for (; (uVar7 = uVar8, uVar8 != uVar6 &&
           (uVar7 = uVar6, (lws_protocols *)((long)&vhost->protocols->name + lVar4) != prot));
        lVar4 = lVar4 + 0x38) {
      uVar6 = uVar6 + 1;
    }
    if ((uint)uVar7 == uVar1) {
      lVar4 = 0;
      for (uVar6 = 0; uVar7 = uVar8, uVar8 != uVar6; uVar6 = uVar6 + 1) {
        __s1 = *(char **)((long)&vhost->protocols->name + lVar4);
        if ((__s1 != (char *)0x0) && (iVar2 = strcmp(__s1,prot->name), iVar2 == 0)) {
          uVar7 = uVar6 & 0xffffffff;
          break;
        }
        lVar4 = lVar4 + 0x38;
      }
      if ((uint)uVar7 == uVar1) {
        _lws_log_cx((vhost->lc).log_cx,lws_log_prepend_vhost,vhost,1,"lws_protocol_vh_priv_zalloc",
                    "unknown protocol %p",prot);
        return (void *)0x0;
      }
    }
    pvVar5 = lws_zalloc((long)size,"vh priv");
    vhost->protocol_vh_privs[uVar7 & 0xffffffff] = pvVar5;
    pvVar5 = vhost->protocol_vh_privs[uVar7 & 0xffffffff];
  }
  return pvVar5;
}

Assistant:

void *
lws_protocol_vh_priv_zalloc(struct lws_vhost *vhost,
			    const struct lws_protocols *prot, int size)
{
	int n = 0;

	if (!vhost || !prot || !vhost->protocols || !prot->name)
		return NULL;

	/* allocate the vh priv array only on demand */
	if (!vhost->protocol_vh_privs) {
		vhost->protocol_vh_privs = (void **)lws_zalloc(
				(size_t)vhost->count_protocols * sizeof(void *),
				"protocol_vh_privs");

		if (!vhost->protocol_vh_privs)
			return NULL;
	}

	while (n < vhost->count_protocols && &vhost->protocols[n] != prot)
		n++;

	if (n == vhost->count_protocols) {
		n = 0;
		while (n < vhost->count_protocols) {
			if (vhost->protocols[n].name &&
			    !strcmp(vhost->protocols[n].name, prot->name))
				break;
			n++;
		}

		if (n == vhost->count_protocols) {
			lwsl_vhost_err(vhost, "unknown protocol %p", prot);
			return NULL;
		}
	}

	vhost->protocol_vh_privs[n] = lws_zalloc((size_t)size, "vh priv");
	return vhost->protocol_vh_privs[n];
}